

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

optional<std::shared_ptr<LiteralExpressionAstNode>_> * __thiscall
Parser::parseLiteralExpression
          (optional<std::shared_ptr<LiteralExpressionAstNode>_> *__return_storage_ptr__,Parser *this
          )

{
  TokenType TVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_58 [16];
  element_type *local_48;
  shared_ptr<Token> token;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  TokenBuffer::currentToken((TokenBuffer *)&stack0xffffffffffffffb8);
  TVar1 = local_48->tokenType;
  if (token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if ((TVar1 < BuiltInFunctionName) &&
     ((0xe300000U >> (TVar1 & (BuiltInFunctionName|RightCurly)) & 1) != 0)) {
    TokenBuffer::currentToken((TokenBuffer *)&stack0xffffffffffffffb8);
    TokenBuffer::nextToken((TokenBuffer *)local_58);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<LiteralExpressionAstNode,std::allocator<LiteralExpressionAstNode>,std::shared_ptr<Token>&>
              (&stack0xffffffffffffffd0,
               (LiteralExpressionAstNode **)
               &token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (allocator<LiteralExpressionAstNode> *)&stack0xffffffffffffffdf,
               (shared_ptr<Token> *)&stack0xffffffffffffffb8);
    _Var2._M_pi = local_30._M_pi;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<LiteralExpressionAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<LiteralExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<LiteralExpressionAstNode>_>._M_payload._M_value.
    super___shared_ptr<LiteralExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<LiteralExpressionAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<LiteralExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<LiteralExpressionAstNode>_>._M_payload._M_value.
    super___shared_ptr<LiteralExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<LiteralExpressionAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<LiteralExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<LiteralExpressionAstNode>_>._M_payload._M_value.
    super___shared_ptr<LiteralExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var2._M_pi;
    token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<LiteralExpressionAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<LiteralExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<LiteralExpressionAstNode>_>._M_engaged = true;
    if (token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<LiteralExpressionAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<LiteralExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<LiteralExpressionAstNode>_>._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<LiteralExpressionAstNode>>
Parser::parseLiteralExpression() noexcept {

  switch (this->tokenBuffer->currentToken()->tokenType)  {
    case TokenType::BooleanLiteral:
    case TokenType::StringLiteral:
    case TokenType::IntegerLiteral:
    case TokenType::FloatLiteral:
    case TokenType::UndefinedLiteral:
      break;
    default:
      return std::nullopt;
  }

  auto token = this->tokenBuffer->currentToken();
  this->tokenBuffer->nextToken();
  return std::make_shared<LiteralExpressionAstNode>(token);
}